

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::to_sampler_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t id)

{
  ulong uVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string expr;
  string local_58;
  string local_38;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  CompilerGLSL::to_expression_abi_cxx11_(&local_38,&this->super_CompilerGLSL,id,true);
  join<char_const(&)[2],std::__cxx11::string>
            (&local_58,(spirv_cross *)0x2e3de5,(char (*) [2])&local_38,ts_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  uVar1 = ::std::__cxx11::string::find((char)&local_58,0x5b);
  if (uVar1 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    plVar2 = (long *)::std::__cxx11::string::replace((ulong)&local_58,uVar1,(char *)0x0,0x2e3873);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_sampler_expression(uint32_t id)
{
	auto expr = join("_", to_expression(id));
	auto index = expr.find_first_of('[');
	if (index == string::npos)
	{
		return expr + "_sampler";
	}
	else
	{
		// We have an expression like _ident[array], so we cannot tack on _sampler, insert it inside the string instead.
		return expr.insert(index, "_sampler");
	}
}